

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

int ON_wString::MapStringOrdinal
              (ON_StringMapOrdinalType map_type,wchar_t *string,int element_count,
              wchar_t *mapped_string,int mapped_string_capacity)

{
  wchar_t wVar1;
  wchar_t *s1;
  wchar_t *pwStack_28;
  int mapped_string_capacity_local;
  wchar_t *mapped_string_local;
  wchar_t *pwStack_18;
  int element_count_local;
  wchar_t *string_local;
  ON_StringMapOrdinalType map_type_local;
  
  if (mapped_string_capacity != 0) {
    if ((mapped_string == (wchar_t *)0x0) || (mapped_string_capacity < 1)) {
      return 0;
    }
    if (string != mapped_string) {
      *mapped_string = L'\0';
    }
  }
  if (element_count < 0) {
    mapped_string_local._4_4_ = Length(string);
    if (mapped_string_local._4_4_ < 0) {
      return 0;
    }
    if (mapped_string_capacity == 0) {
      return mapped_string_local._4_4_ + 1;
    }
  }
  else {
    mapped_string_local._4_4_ = element_count;
    if (mapped_string_capacity == 0) {
      return element_count;
    }
  }
  if (mapped_string_capacity < mapped_string_local._4_4_) {
    string_local._4_4_ = 0;
  }
  else {
    pwStack_28 = mapped_string;
    pwStack_18 = string;
    while (pwStack_18 < string + mapped_string_local._4_4_) {
      wVar1 = MapCharacterOrdinal(map_type,*pwStack_18);
      *pwStack_28 = wVar1;
      pwStack_28 = pwStack_28 + 1;
      pwStack_18 = pwStack_18 + 1;
    }
    if (mapped_string_local._4_4_ < mapped_string_capacity) {
      *pwStack_28 = L'\0';
    }
    string_local._4_4_ = mapped_string_local._4_4_;
  }
  return string_local._4_4_;
}

Assistant:

int ON_wString::MapStringOrdinal(
  ON_StringMapOrdinalType map_type,
  const wchar_t* string,
  int element_count,
  wchar_t* mapped_string,
  int mapped_string_capacity
  )
{
  if (0 != mapped_string_capacity)
  {
    if (nullptr == mapped_string || mapped_string_capacity <= 0)
      return 0;

    if (string != mapped_string)
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_wString::Length(string);
    if (element_count < 0)
      return 0;
    if ( 0 == mapped_string_capacity )
      return element_count+1; // +1 for null terminator
  }
  else if ( 0 == mapped_string_capacity )
    return element_count; // no +1 here

  if ( element_count > mapped_string_capacity )
    return 0;

  const wchar_t* s1 = string + element_count;
  while (string < s1)
    *mapped_string++ = ON_wString::MapCharacterOrdinal(map_type,*string++);

  if ( element_count < mapped_string_capacity )
    *mapped_string = 0;

  return element_count;
}